

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

Result __thiscall
wabt::interp::Memory::AtomicRmwCmpxchg<unsigned_char>
          (Memory *this,u64 offset,u64 addend,uchar expect,uchar replace,uchar *out)

{
  bool bVar1;
  Result RVar2;
  uchar local_39;
  uchar *puStack_38;
  uchar read;
  uchar *out_local;
  uchar replace_local;
  u64 uStack_28;
  uchar expect_local;
  u64 addend_local;
  u64 offset_local;
  Memory *this_local;
  
  puStack_38 = out;
  out_local._6_1_ = replace;
  out_local._7_1_ = expect;
  uStack_28 = addend;
  addend_local = offset;
  offset_local = (u64)this;
  RVar2 = AtomicLoad<unsigned_char>(this,offset,addend,&local_39);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    if (local_39 == out_local._7_1_) {
      RVar2 = AtomicStore<unsigned_char>(this,addend_local,uStack_28,out_local._6_1_);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
    }
    *puStack_38 = local_39;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Memory::AtomicRmwCmpxchg(u64 offset,
                                u64 addend,
                                T expect,
                                T replace,
                                T* out) {
  T read;
  CHECK_RESULT(AtomicLoad(offset, addend, &read));
  if (read == expect) {
    CHECK_RESULT(AtomicStore(offset, addend, replace));
  }
  *out = read;
  return Result::Ok;
}